

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

void cleanup_ghost(void)

{
  ghost *pgVar1;
  ghost_level *pgVar2;
  
  for (pgVar1 = ghosts; pgVar1 != (ghost *)0x0; pgVar1 = pgVar1->next) {
    for (pgVar2 = pgVar1->level; pgVar2 != (ghost_level *)0x0; pgVar2 = pgVar2->next) {
      if (pgVar2->blow_effect1 != (char *)0x0) {
        string_free(pgVar2->blow_effect1);
      }
      if (pgVar2->blow_effect2 != (char *)0x0) {
        string_free(pgVar2->blow_effect2);
      }
    }
    string_free(pgVar1->name);
  }
  mem_free(ghosts);
  return;
}

Assistant:

static void cleanup_ghost(void)
{
	struct ghost *g;
	for (g = ghosts; g; g = g->next) {
		struct ghost_level *l;
		for (l = g->level; l; l = l->next) {
			if (l->blow_effect1) string_free(l->blow_effect1);
			if (l->blow_effect2) string_free(l->blow_effect2);
		}
		string_free(g->name);
	}
	mem_free(ghosts);
}